

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.hpp
# Opt level: O1

void __thiscall
duckdb::CreateSecretFunctionSet::~CreateSecretFunctionSet(CreateSecretFunctionSet *this)

{
  pointer pcVar1;
  
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunction>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->functions)._M_h);
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

explicit CreateSecretFunctionSet(string &name) : name(name) {}